

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

RSAKey * BinarySource_get_rsa_ssh1_priv_agent(BinarySource *src)

{
  RSAKey *rsa_00;
  mp_int *pmVar1;
  RSAKey *rsa;
  BinarySource *src_local;
  
  rsa_00 = (RSAKey *)safemalloc(1,0x48,0);
  memset(rsa_00,0,0x48);
  BinarySource_get_rsa_ssh1_pub(src->binarysource_,rsa_00,RSA_SSH1_MODULUS_FIRST);
  BinarySource_get_rsa_ssh1_priv(src->binarysource_,rsa_00);
  pmVar1 = BinarySource_get_mp_ssh1(src->binarysource_);
  rsa_00->iqmp = pmVar1;
  pmVar1 = BinarySource_get_mp_ssh1(src->binarysource_);
  rsa_00->q = pmVar1;
  pmVar1 = BinarySource_get_mp_ssh1(src->binarysource_);
  rsa_00->p = pmVar1;
  return rsa_00;
}

Assistant:

RSAKey *BinarySource_get_rsa_ssh1_priv_agent(BinarySource *src)
{
    RSAKey *rsa = snew(RSAKey);
    memset(rsa, 0, sizeof(RSAKey));

    get_rsa_ssh1_pub(src, rsa, RSA_SSH1_MODULUS_FIRST);
    get_rsa_ssh1_priv(src, rsa);

    /* SSH-1 names p and q the other way round, i.e. we have the
     * inverse of p mod q and not of q mod p. We swap the names,
     * because our internal RSA wants iqmp. */
    rsa->iqmp = get_mp_ssh1(src);
    rsa->q = get_mp_ssh1(src);
    rsa->p = get_mp_ssh1(src);

    return rsa;
}